

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_spec_constant_op_and_composite_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::FoldSpecConstantOpAndCompositePass::ProcessOpSpecConstantOp
          (FoldSpecConstantOpAndCompositePass *this,inst_iterator *pos)

{
  uint32_t after;
  uint32_t before;
  Instruction *this_00;
  Operand *pOVar1;
  IRContext *pIVar2;
  uint32_t old_id;
  uint32_t new_id;
  Instruction *folded_inst;
  Instruction *inst;
  inst_iterator *pos_local;
  FoldSpecConstantOpAndCompositePass *this_local;
  
  this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
            iterator_template<spvtools::opt::Instruction>::operator*(&pos->super_iterator);
  pOVar1 = opt::Instruction::GetInOperand(this_00,0);
  if (pOVar1->type == SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER) {
    _old_id = FoldWithInstructionFolder(this,pos);
    if (_old_id == (Instruction *)0x0) {
      _old_id = DoComponentWiseOperation(this,pos);
    }
    if (_old_id != (Instruction *)0x0) {
      after = opt::Instruction::result_id(_old_id);
      before = opt::Instruction::result_id(this_00);
      pIVar2 = Pass::context(&this->super_Pass);
      IRContext::ReplaceAllUsesWith(pIVar2,before,after);
      pIVar2 = Pass::context(&this->super_Pass);
      IRContext::KillDef(pIVar2,before);
    }
    return _old_id != (Instruction *)0x0;
  }
  __assert_fail("inst->GetInOperand(0).type == SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER && \"The first in-operand of OpSpecConstantOp instruction must be of \" \"SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER type\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold_spec_constant_op_and_composite_pass.cpp"
                ,0x74,
                "bool spvtools::opt::FoldSpecConstantOpAndCompositePass::ProcessOpSpecConstantOp(Module::inst_iterator *)"
               );
}

Assistant:

bool FoldSpecConstantOpAndCompositePass::ProcessOpSpecConstantOp(
    Module::inst_iterator* pos) {
  Instruction* inst = &**pos;
  Instruction* folded_inst = nullptr;
  assert(inst->GetInOperand(0).type ==
             SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER &&
         "The first in-operand of OpSpecConstantOp instruction must be of "
         "SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER type");

  folded_inst = FoldWithInstructionFolder(pos);
  if (!folded_inst) {
    folded_inst = DoComponentWiseOperation(pos);
  }
  if (!folded_inst) return false;

  // Replace the original constant with the new folded constant, kill the
  // original constant.
  uint32_t new_id = folded_inst->result_id();
  uint32_t old_id = inst->result_id();
  context()->ReplaceAllUsesWith(old_id, new_id);
  context()->KillDef(old_id);
  return true;
}